

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O0

Status __thiscall spvtools::opt::AmdExtensionToKhrPass::Process(AmdExtensionToKhrPass *this)

{
  Instruction *inst_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  Status SVar4;
  IRContext *pIVar5;
  AmdExtFoldingRules *this_00;
  IRContext *ctx;
  Module *pMVar6;
  DebugScope this_01;
  Operand *pOVar7;
  size_type sVar8;
  reference ppIVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  uint32_t version;
  Instruction *inst_2;
  iterator __end2_3;
  iterator __begin2_3;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2_3;
  string local_220;
  Instruction *local_200;
  Instruction *inst_1;
  iterator __end2_2;
  iterator __begin2_2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2_2;
  string local_1c8;
  undefined8 local_1a8;
  Instruction *inst;
  iterator __end2_1;
  iterator __begin2_1;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2_1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> to_be_killed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string asStack_138 [32];
  string asStack_118 [32];
  iterator local_f8;
  __node_base local_f0;
  undefined1 local_e8 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ext_to_remove;
  function<void_(spvtools::opt::Instruction_*)> local_a8;
  DebugScope local_88;
  Function *func;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  unique_ptr<spvtools::opt::(anonymous_namespace)::AmdExtConstFoldingRules,_std::default_delete<spvtools::opt::(anonymous_namespace)::AmdExtConstFoldingRules>_>
  local_50;
  unique_ptr<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
  local_48;
  unique_ptr<spvtools::opt::(anonymous_namespace)::AmdExtFoldingRules,_std::default_delete<spvtools::opt::(anonymous_namespace)::AmdExtFoldingRules>_>
  local_40;
  unique_ptr<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
  local_38;
  undefined1 local_30 [8];
  InstructionFolder folder;
  bool changed;
  AmdExtensionToKhrPass *this_local;
  
  folder.folding_rules_._M_t.
  super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
  .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl._7_1_ = 0;
  pIVar5 = Pass::context(&this->super_Pass);
  this_00 = (AmdExtFoldingRules *)::operator_new(0x90);
  ctx = Pass::context(&this->super_Pass);
  anon_unknown_7::AmdExtFoldingRules::AmdExtFoldingRules(this_00,ctx);
  std::
  unique_ptr<spvtools::opt::(anonymous_namespace)::AmdExtFoldingRules,std::default_delete<spvtools::opt::(anonymous_namespace)::AmdExtFoldingRules>>
  ::unique_ptr<std::default_delete<spvtools::opt::(anonymous_namespace)::AmdExtFoldingRules>,void>
            ((unique_ptr<spvtools::opt::(anonymous_namespace)::AmdExtFoldingRules,std::default_delete<spvtools::opt::(anonymous_namespace)::AmdExtFoldingRules>>
              *)&local_40,this_00);
  std::unique_ptr<spvtools::opt::FoldingRules,std::default_delete<spvtools::opt::FoldingRules>>::
  unique_ptr<spvtools::opt::(anonymous_namespace)::AmdExtFoldingRules,std::default_delete<spvtools::opt::(anonymous_namespace)::AmdExtFoldingRules>,void>
            ((unique_ptr<spvtools::opt::FoldingRules,std::default_delete<spvtools::opt::FoldingRules>>
              *)&local_38,&local_40);
  __range2 = (Module *)Pass::context(&this->super_Pass);
  MakeUnique<spvtools::opt::(anonymous_namespace)::AmdExtConstFoldingRules,spvtools::opt::IRContext*>
            ((spvtools *)&local_50,(IRContext **)&__range2);
  std::
  unique_ptr<spvtools::opt::ConstantFoldingRules,std::default_delete<spvtools::opt::ConstantFoldingRules>>
  ::
  unique_ptr<spvtools::opt::(anonymous_namespace)::AmdExtConstFoldingRules,std::default_delete<spvtools::opt::(anonymous_namespace)::AmdExtConstFoldingRules>,void>
            ((unique_ptr<spvtools::opt::ConstantFoldingRules,std::default_delete<spvtools::opt::ConstantFoldingRules>>
              *)&local_48,&local_50);
  InstructionFolder::InstructionFolder((InstructionFolder *)local_30,pIVar5,&local_38,&local_48);
  std::
  unique_ptr<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
  ::~unique_ptr(&local_48);
  std::
  unique_ptr<spvtools::opt::(anonymous_namespace)::AmdExtConstFoldingRules,_std::default_delete<spvtools::opt::(anonymous_namespace)::AmdExtConstFoldingRules>_>
  ::~unique_ptr(&local_50);
  std::unique_ptr<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>::
  ~unique_ptr(&local_38);
  std::
  unique_ptr<spvtools::opt::(anonymous_namespace)::AmdExtFoldingRules,_std::default_delete<spvtools::opt::(anonymous_namespace)::AmdExtFoldingRules>_>
  ::~unique_ptr(&local_40);
  pMVar6 = Pass::get_module(&this->super_Pass);
  join_0x00000010_0x00000000_ = Module::begin(pMVar6);
  _func = Module::end(pMVar6);
  while (bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                           ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_,
                            (UptrVectorIterator<spvtools::opt::Function,_false> *)&func), bVar1) {
    this_01 = (DebugScope)
              UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                        ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
    ext_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (long)&folder.folding_rules_._M_t.
                super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
                .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false> + 7;
    local_88 = this_01;
    std::function<void(spvtools::opt::Instruction*)>::
    function<spvtools::opt::AmdExtensionToKhrPass::Process()::__0,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_a8,
               (anon_class_16_2_d1d79171 *)
               &ext_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count);
    opt::Function::ForEachInst((Function *)this_01,&local_a8,false,false);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_a8);
    UptrVectorIterator<spvtools::opt::Function,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"SPV_AMD_shader_ballot",
             (allocator<char> *)
             ((long)&to_be_killed.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_138,"SPV_AMD_shader_trinary_minmax",
             (allocator<char> *)
             ((long)&to_be_killed.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_118,"SPV_AMD_gcn_shader",
             (allocator<char> *)
             ((long)&to_be_killed.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_f8 = &local_158;
  local_f0._M_nxt = (_Hash_node_base *)0x3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&to_be_killed.
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  __l._M_len = (size_type)local_f0._M_nxt;
  __l._M_array = local_f8;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_e8,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        ((long)&to_be_killed.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
        (allocator_type *)
        ((long)&to_be_killed.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&to_be_killed.
                        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  local_278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8;
  do {
    local_278 = local_278 + -1;
    std::__cxx11::string::~string((string *)local_278);
  } while (local_278 != &local_158);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&to_be_killed.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&to_be_killed.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&to_be_killed.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__range2_1);
  pIVar5 = Pass::context(&this->super_Pass);
  IRContext::module(pIVar5);
  Module::extensions((Module *)&__begin2_1);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2_1);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&inst);
  while (bVar1 = utils::operator!=(&__end2_1.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&inst), bVar1) {
    local_1a8 = utils::IntrusiveList<spvtools::opt::Instruction>::
                iterator_template<spvtools::opt::Instruction>::operator*(&__end2_1.super_iterator);
    OVar2 = opt::Instruction::opcode((Instruction *)local_1a8);
    if (OVar2 == OpExtension) {
      pOVar7 = opt::Instruction::GetInOperand((Instruction *)local_1a8,0);
      Operand::AsString_abi_cxx11_(&local_1c8,pOVar7);
      sVar8 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_e8,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      if (sVar8 != 0) {
        __range2_2 = (IteratorRange<spvtools::opt::InstructionList::iterator> *)local_1a8;
        std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)&__range2_1,(value_type *)&__range2_2);
      }
    }
    InstructionList::iterator::operator++(&__end2_1);
  }
  Pass::context(&this->super_Pass);
  IRContext::ext_inst_imports((IRContext *)&__begin2_2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2_2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&inst_1);
  while (bVar1 = utils::operator!=(&__end2_2.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&inst_1), bVar1)
  {
    local_200 = utils::IntrusiveList<spvtools::opt::Instruction>::
                iterator_template<spvtools::opt::Instruction>::operator*(&__end2_2.super_iterator);
    OVar2 = opt::Instruction::opcode(local_200);
    if (OVar2 == OpExtInstImport) {
      pOVar7 = opt::Instruction::GetInOperand(local_200,0);
      Operand::AsString_abi_cxx11_(&local_220,pOVar7);
      sVar8 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_e8,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      if (sVar8 != 0) {
        __range2_3 = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)local_200;
        std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)&__range2_1,(value_type *)&__range2_3);
      }
    }
    InstructionList::iterator::operator++(&__end2_2);
  }
  __end2_3 = std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)&__range2_1);
  inst_2 = (Instruction *)
           std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&__range2_1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_3,
                            (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                             *)&inst_2), bVar1) {
    ppIVar9 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2_3);
    inst_00 = *ppIVar9;
    pIVar5 = Pass::context(&this->super_Pass);
    IRContext::KillInst(pIVar5,inst_00);
    folder.folding_rules_._M_t.
    super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
    .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl._7_1_ = 1;
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2_3);
  }
  if ((folder.folding_rules_._M_t.
       super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
       .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl._7_1_ & 1) != 0) {
    pMVar6 = Pass::get_module(&this->super_Pass);
    uVar3 = Module::version(pMVar6);
    if (uVar3 < 0x10300) {
      pMVar6 = Pass::get_module(&this->super_Pass);
      Module::set_version(pMVar6,0x10300);
    }
  }
  SVar4 = SuccessWithoutChange;
  if ((folder.folding_rules_._M_t.
       super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
       .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl._7_1_ & 1) != 0) {
    SVar4 = SuccessWithChange;
  }
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__range2_1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_e8);
  InstructionFolder::~InstructionFolder((InstructionFolder *)local_30);
  return SVar4;
}

Assistant:

Pass::Status AmdExtensionToKhrPass::Process() {
  bool changed = false;

  // Traverse the body of the functions to replace instructions that require
  // the extensions.
  InstructionFolder folder(
      context(),
      std::unique_ptr<AmdExtFoldingRules>(new AmdExtFoldingRules(context())),
      MakeUnique<AmdExtConstFoldingRules>(context()));
  for (Function& func : *get_module()) {
    func.ForEachInst([&changed, &folder](Instruction* inst) {
      if (folder.FoldInstruction(inst)) {
        changed = true;
      }
    });
  }

  // Now that instruction that require the extensions have been removed, we can
  // remove the extension instructions.
  std::set<std::string> ext_to_remove = {"SPV_AMD_shader_ballot",
                                         "SPV_AMD_shader_trinary_minmax",
                                         "SPV_AMD_gcn_shader"};

  std::vector<Instruction*> to_be_killed;
  for (Instruction& inst : context()->module()->extensions()) {
    if (inst.opcode() == spv::Op::OpExtension) {
      if (ext_to_remove.count(inst.GetInOperand(0).AsString()) != 0) {
        to_be_killed.push_back(&inst);
      }
    }
  }

  for (Instruction& inst : context()->ext_inst_imports()) {
    if (inst.opcode() == spv::Op::OpExtInstImport) {
      if (ext_to_remove.count(inst.GetInOperand(0).AsString()) != 0) {
        to_be_killed.push_back(&inst);
      }
    }
  }

  for (Instruction* inst : to_be_killed) {
    context()->KillInst(inst);
    changed = true;
  }

  // The replacements that take place use instructions that are missing before
  // SPIR-V 1.3. If we changed something, we will have to make sure the version
  // is at least SPIR-V 1.3 to make sure those instruction can be used.
  if (changed) {
    uint32_t version = get_module()->version();
    if (version < 0x00010300 /*1.3*/) {
      get_module()->set_version(0x00010300);
    }
  }
  return changed ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}